

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

void __thiscall
amrex::StateDescriptor::cleanUpMaps
          (StateDescriptor *this,InterpBase ***maps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  if (*maps != (InterpBase **)0x0) {
    operator_delete__(*maps);
  }
  if (*map_start_comp != (int *)0x0) {
    operator_delete__(*map_start_comp);
  }
  if (*map_num_comp != (int *)0x0) {
    operator_delete__(*map_num_comp);
  }
  if (*max_start_comp != (int *)0x0) {
    operator_delete__(*max_start_comp);
  }
  if (*min_end_comp != (int *)0x0) {
    operator_delete__(*min_end_comp);
    return;
  }
  return;
}

Assistant:

void
StateDescriptor::cleanUpMaps (InterpBase**&   maps,
                              int*&           map_start_comp,
                              int*&           map_num_comp,
                              int*&           max_start_comp,
                              int*&           min_end_comp) const
{
    delete [] maps;
    delete [] map_start_comp;
    delete [] map_num_comp;
    delete [] max_start_comp;
    delete [] min_end_comp;
}